

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>_>
::~Stack(Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>_>
         *this)

{
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
  *this_00;
  
  this_00 = this->_cursor;
  while (this_00 != this->_stack) {
    this_00 = this_00 + -1;
    std::
    unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
    ::~unique_ptr(this_00);
  }
  if (this_00 !=
      (unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
       *)0x0) {
    Lib::free(this->_stack);
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }